

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O1

int disp_artifact_discoveries(menulist *menu)

{
  char cVar1;
  short sVar2;
  int iVar3;
  nh_menuitem *pnVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  char buf [256];
  char acStack_138 [264];
  
  lVar8 = 0;
  do {
    if (artidisco[lVar8] == '\0') goto LAB_0014d379;
    if (lVar8 == 0) {
      iVar3 = menu->size;
      if (iVar3 <= menu->icount) {
        menu->size = iVar3 * 2;
        pnVar4 = (nh_menuitem *)realloc(menu->items,(long)iVar3 * 0x218);
        menu->items = pnVar4;
      }
      pnVar4 = menu->items;
      iVar3 = menu->icount;
      pnVar4[iVar3].id = 0;
      pnVar4[iVar3].role = MI_HEADING;
      pnVar4[iVar3].accel = '\0';
      pnVar4[iVar3].group_accel = '\0';
      pnVar4[iVar3].selected = '\0';
      builtin_strncpy(pnVar4[iVar3].caption,"Artifact",8);
      pnVar4[iVar3].caption[8] = 's';
      pnVar4[iVar3].caption[9] = '\0';
      menu->icount = menu->icount + 1;
    }
    cVar1 = artidisco[lVar8];
    sVar2 = artilist[cVar1].otyp;
    pcVar7 = "";
    if (0xffffffdb < (int)cVar1 - 0x25U) {
      pcVar7 = artilist[(uint)(int)cVar1].name;
    }
    pcVar5 = align_str(artilist[cVar1].alignment);
    pcVar6 = simple_typename((int)sVar2);
    sprintf(acStack_138,"  %s [%s %s]",pcVar7,pcVar5,pcVar6);
    iVar3 = menu->size;
    if (iVar3 <= menu->icount) {
      menu->size = iVar3 * 2;
      pnVar4 = (nh_menuitem *)realloc(menu->items,(long)iVar3 * 0x218);
      menu->items = pnVar4;
    }
    pnVar4 = menu->items + menu->icount;
    pnVar4->id = 0;
    pnVar4->role = MI_TEXT;
    pnVar4->accel = '\0';
    pnVar4->group_accel = '\0';
    pnVar4->selected = '\0';
    strcpy(pnVar4->caption,acStack_138);
    menu->icount = menu->icount + 1;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x24);
  lVar8 = 0x24;
LAB_0014d379:
  return (int)lVar8;
}

Assistant:

int disp_artifact_discoveries(
    struct menulist *menu /* supplied by dodiscover() */
    )
{
    int i, m, otyp;
    char buf[BUFSZ];

    for (i = 0; i < NROFARTIFACTS; i++) {
	if (artidisco[i] == 0) break;	/* empty slot implies end of list */
	if (i == 0)
	    add_menuheading(menu, "Artifacts");
	m = artidisco[i];
	otyp = artilist[m].otyp;
	sprintf(buf, "  %s [%s %s]", artiname(m),
		align_str(artilist[m].alignment), simple_typename(otyp));
	add_menutext(menu, buf);
    }
    return i;
}